

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::execute_positive_test
          (TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,string *vertex_shader_source,
          string *tess_ctrl_shader_source,string *tess_eval_shader_source,
          string *geometry_shader_source,string *fragment_shader_source,
          string *compute_shader_source,bool delete_generated_objects,bool require_gpu_shader5)

{
  byte bVar1;
  int iVar2;
  GLint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  int local_4c;
  bool test_result;
  bool test_compute;
  long lStack_48;
  GLint link_status;
  Functions *gl;
  GLint compile_status;
  bool require_gpu_shader5_local;
  bool delete_generated_objects_local;
  string *fragment_shader_source_local;
  string *geometry_shader_source_local;
  string *tess_eval_shader_source_local;
  string *tess_ctrl_shader_source_local;
  string *vertex_shader_source_local;
  TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  gl._7_1_ = delete_generated_objects;
  gl._6_1_ = require_gpu_shader5;
  gl._0_4_ = 1;
  _compile_status = fragment_shader_source;
  fragment_shader_source_local = geometry_shader_source;
  geometry_shader_source_local = tess_eval_shader_source;
  tess_eval_shader_source_local = tess_ctrl_shader_source;
  tess_ctrl_shader_source_local = vertex_shader_source;
  vertex_shader_source_local = (string *)this;
  pRVar5 = deqp::Context::getRenderContext(this->context_id);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_48 = CONCAT44(extraout_var,iVar2);
  local_4c = 1;
  bVar1 = std::__cxx11::string::empty();
  bVar1 = (bVar1 ^ 0xff) & 1;
  if (bVar1 == 0) {
    gl._0_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                         (this,_compile_status,0,(ulong)(gl._6_1_ & 1));
    if ((int)gl == 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "The fragment shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x412);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    gl._0_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                         (this,fragment_shader_source_local,3,(ulong)(gl._6_1_ & 1));
    if ((int)gl == 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "The geometry shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x41d);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    gl._0_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                         (this,geometry_shader_source_local,5,(ulong)(gl._6_1_ & 1));
    if ((int)gl == 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "The tesselation evaluation shader was expected to compile successfully, but failed to compile."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x428);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    gl._0_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                         (this,tess_eval_shader_source_local,4,(ulong)(gl._6_1_ & 1));
    if ((int)gl == 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "The tesselation control shader was expected to compile successfully, but failed to compile."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x433);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    gl._0_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                         (this,tess_ctrl_shader_source_local,1,(ulong)(gl._6_1_ & 1));
    if ((int)gl == 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "The vertex shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x43e);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  else {
    gl._0_4_ = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                         (this,compute_shader_source,2,(ulong)(gl._6_1_ & 1));
    if ((int)gl == 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "The compute shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,1099);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  GVar3 = (**(code **)(lStack_48 + 0x3c8))();
  this->program_object_id = GVar3;
  dVar4 = (**(code **)(lStack_48 + 0x800))();
  glu::checkError(dVar4,"Could not create a program object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x455);
  if (bVar1 == 0) {
    (**(code **)(lStack_48 + 0x10))(this->program_object_id,this->fragment_shader_object_id);
    if (this->geometry_shader_object_id != 0) {
      (**(code **)(lStack_48 + 0x10))(this->program_object_id,this->geometry_shader_object_id);
    }
    if (this->tess_ctrl_shader_object_id != 0) {
      (**(code **)(lStack_48 + 0x10))(this->program_object_id,this->tess_ctrl_shader_object_id);
    }
    if (this->tess_eval_shader_object_id != 0) {
      (**(code **)(lStack_48 + 0x10))(this->program_object_id,this->tess_eval_shader_object_id);
    }
    (**(code **)(lStack_48 + 0x10))(this->program_object_id,this->vertex_shader_object_id);
  }
  else {
    (**(code **)(lStack_48 + 0x10))(this->program_object_id,this->compute_shader_object_id);
  }
  dVar4 = (**(code **)(lStack_48 + 0x800))();
  glu::checkError(dVar4,"glAttachShader() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x471);
  if (bVar1 == 0) {
    (**(code **)(lStack_48 + 0x470))(this->fragment_shader_object_id);
    if (this->geometry_shader_object_id != 0) {
      (**(code **)(lStack_48 + 0x470))(this->geometry_shader_object_id);
    }
    if (this->tess_ctrl_shader_object_id != 0) {
      (**(code **)(lStack_48 + 0x470))(this->tess_ctrl_shader_object_id);
    }
    if (this->tess_eval_shader_object_id != 0) {
      (**(code **)(lStack_48 + 0x470))(this->tess_eval_shader_object_id);
    }
    (**(code **)(lStack_48 + 0x470))(this->vertex_shader_object_id);
  }
  else {
    (**(code **)(lStack_48 + 0x470))(this->compute_shader_object_id);
  }
  this->fragment_shader_object_id = 0;
  this->vertex_shader_object_id = 0;
  this->geometry_shader_object_id = 0;
  this->tess_ctrl_shader_object_id = 0;
  this->tess_eval_shader_object_id = 0;
  this->compute_shader_object_id = 0;
  (**(code **)(lStack_48 + 0xce8))(this->program_object_id);
  dVar4 = (**(code **)(lStack_48 + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x496);
  (**(code **)(lStack_48 + 0x9d8))(this->program_object_id,0x8b82,&local_4c);
  dVar4 = (**(code **)(lStack_48 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x49a);
  if (local_4c != 1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Linking was expected to succeed, but the process was unsuccessful.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x4bf);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if ((gl._7_1_ & 1) != 0) {
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])();
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return CONTINUE;
}

Assistant:

tcu::TestNode::IterateResult TestCaseBase<API>::execute_positive_test(
	const std::string& vertex_shader_source, const std::string& tess_ctrl_shader_source,
	const std::string& tess_eval_shader_source, const std::string& geometry_shader_source,
	const std::string& fragment_shader_source, const std::string& compute_shader_source, bool delete_generated_objects,
	bool require_gpu_shader5)
{
	glw::GLint			  compile_status = GL_TRUE;
	const glw::Functions& gl			 = context_id.getRenderContext().getFunctions();
	glw::GLint			  link_status	= GL_TRUE;
	bool				  test_compute   = !compute_shader_source.empty();
	bool				  test_result	= true;

	if (false == test_compute)
	{
		/* Compile, and check the compilation result for the fragment shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			fragment_shader_source, TestCaseBase<API>::FRAGMENT_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The fragment shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the geometry shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			geometry_shader_source, TestCaseBase<API>::GEOMETRY_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The geometry shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the te shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			tess_eval_shader_source, TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The tesselation evaluation shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the tc shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			tess_ctrl_shader_source, TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The tesselation control shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the vertex shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			vertex_shader_source, TestCaseBase<API>::VERTEX_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The vertex shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}
	}
	else
	{
		/* Compile, and check the compilation result for the compute shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			compute_shader_source, TestCaseBase<API>::COMPUTE_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The compute shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}
	}

	if (true == test_result)
	{
		/* Create program object. */
		program_object_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a program object.");

		/* Configure the program object */
		if (false == test_compute)
		{
			gl.attachShader(program_object_id, fragment_shader_object_id);

			if (geometry_shader_object_id)
			{
				gl.attachShader(program_object_id, geometry_shader_object_id);
			}

			if (tess_ctrl_shader_object_id)
			{
				gl.attachShader(program_object_id, tess_ctrl_shader_object_id);
			}

			if (tess_eval_shader_object_id)
			{
				gl.attachShader(program_object_id, tess_eval_shader_object_id);
			}

			gl.attachShader(program_object_id, vertex_shader_object_id);
		}
		else
		{
			gl.attachShader(program_object_id, compute_shader_object_id);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed.");

		if (false == test_compute)
		{
			gl.deleteShader(fragment_shader_object_id);

			if (geometry_shader_object_id)
			{
				gl.deleteShader(geometry_shader_object_id);
			}

			if (tess_ctrl_shader_object_id)
			{
				gl.deleteShader(tess_ctrl_shader_object_id);
			}

			if (tess_eval_shader_object_id)
			{
				gl.deleteShader(tess_eval_shader_object_id);
			}

			gl.deleteShader(vertex_shader_object_id);
		}
		else
		{
			gl.deleteShader(compute_shader_object_id);
		}

		fragment_shader_object_id  = 0;
		vertex_shader_object_id	= 0;
		geometry_shader_object_id  = 0;
		tess_ctrl_shader_object_id = 0;
		tess_eval_shader_object_id = 0;
		compute_shader_object_id   = 0;

		/* Link the program object */
		gl.linkProgram(program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed.");

		/* Make sure the linking operation succeeded. */
		gl.getProgramiv(program_object_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed.");

		if (link_status != GL_TRUE)
		{
#if IS_DEBUG
			glw::GLint  length = 0;
			std::string message;

			/* Get error log length */
			gl.getProgramiv(program_object_id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

			message.resize(length, 0);

			/* Get error log */
			gl.getProgramInfoLog(program_object_id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

			context_id.getTestContext().getLog() << tcu::TestLog::Message << "Error message: " << &message[0]
												 << tcu::TestLog::EndMessage;

#if IS_DEBUG_DUMP_ALL_SHADERS
			if (false == test_compute)
			{
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(vertex_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(tess_ctrl_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(tess_eval_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(geometry_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(fragment_shader_source);
			}
			else
			{
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(compute_shader_source);
			}
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */
#endif /* IS_DEBUG */

			TCU_FAIL("Linking was expected to succeed, but the process was unsuccessful.");

			test_result = false;
		}
	}

	if (delete_generated_objects)
	{
		/* Deallocate any resources used. */
		this->delete_objects();
	}

	/* Return test pass if true. */
	if (true == test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return CONTINUE;
}